

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  uint jmax;
  ARKodeERKStepMem step_mem;
  N_Vector p_Var1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  sunrealtype *psVar4;
  sunrealtype *psVar5;
  ARKodeButcherTable pAVar6;
  sunrealtype *psVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  sunrealtype *psVar11;
  sunrealtype *psVar12;
  uint uVar13;
  sunrealtype sVar14;
  int local_44;
  sunrealtype *local_40;
  N_Vector local_38;
  
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeERKStepMem)0x0) {
    arkProcessError(ark_mem,-0x15,0x58c,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  p_Var1 = ark_mem->ycur;
  local_38 = ark_mem->tempv1;
  psVar2 = step_mem->cvals;
  pp_Var3 = step_mem->Xvecs;
  *dsmPtr = 0.0;
  jmax = step_mem->stages;
  lVar10 = (long)(int)jmax;
  if (lVar10 < 1) {
    uVar13 = 0;
  }
  else {
    lVar9 = 0;
    do {
      psVar2[lVar9] = ark_mem->h * step_mem->B->b[lVar9];
      pp_Var3[lVar9] = step_mem->F[lVar9];
      lVar9 = lVar9 + 1;
      uVar13 = jmax;
    } while (lVar10 != lVar9);
  }
  psVar2[uVar13] = 1.0;
  pp_Var3[uVar13] = ark_mem->yn;
  local_44 = uVar13 + 1;
  local_40 = dsmPtr;
  if (0 < step_mem->nforcing) {
    if ((int)jmax < 1) {
      psVar12 = step_mem->stage_times;
      psVar11 = step_mem->stage_coefs;
    }
    else {
      psVar12 = step_mem->stage_times;
      psVar4 = step_mem->B->c;
      psVar5 = step_mem->B->b;
      psVar11 = step_mem->stage_coefs;
      lVar9 = 0;
      do {
        psVar12[lVar9] = psVar4[lVar9] * ark_mem->h + ark_mem->tn;
        psVar11[lVar9] = ark_mem->h * psVar5[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar10 != lVar9);
    }
    erkStep_ApplyForcing(step_mem,psVar12,psVar11,jmax,&local_44);
  }
  iVar8 = N_VLinearCombination(local_44,psVar2,pp_Var3,p_Var1);
  if (iVar8 != 0) {
    return -0x1c;
  }
  if ((ark_mem->fixedstep != 0) && (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE)) {
    return 0;
  }
  iVar8 = step_mem->stages;
  lVar10 = (long)iVar8;
  if (lVar10 < 1) {
    local_44 = 0;
    if (step_mem->nforcing < 1) goto LAB_00139d13;
LAB_00139cf8:
    psVar12 = step_mem->stage_times;
    psVar11 = step_mem->stage_coefs;
  }
  else {
    lVar9 = 0;
    do {
      psVar2[lVar9] = (step_mem->B->b[lVar9] - step_mem->B->d[lVar9]) * ark_mem->h;
      pp_Var3[lVar9] = step_mem->F[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
    local_44 = iVar8;
    if (step_mem->nforcing < 1) goto LAB_00139d13;
    if (iVar8 < 1) goto LAB_00139cf8;
    pAVar6 = step_mem->B;
    psVar12 = step_mem->stage_times;
    psVar4 = pAVar6->c;
    psVar5 = pAVar6->b;
    psVar7 = pAVar6->d;
    psVar11 = step_mem->stage_coefs;
    lVar9 = 0;
    do {
      psVar12[lVar9] = psVar4[lVar9] * ark_mem->h + ark_mem->tn;
      psVar11[lVar9] = (psVar5[lVar9] - psVar7[lVar9]) * ark_mem->h;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  erkStep_ApplyForcing(step_mem,psVar12,psVar11,iVar8,&local_44);
LAB_00139d13:
  p_Var1 = local_38;
  iVar8 = N_VLinearCombination(local_44,psVar2,pp_Var3,local_38);
  if (iVar8 == 0) {
    sVar14 = (sunrealtype)N_VWrmsNorm(p_Var1,ark_mem->ewt);
    *local_40 = sVar14;
    return 0;
  }
  return -0x1c;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /* apply external polynomial forcing */
  if (step_mem->nforcing > 0)
  {
    for (j = 0; j < step_mem->stages; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * step_mem->B->b[j];
    }
    erkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         step_mem->stages, &nvec);
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity or error accumulation enabled) */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* apply external polynomial forcing */
    if (step_mem->nforcing > 0)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h *
                                   (step_mem->B->b[j] - step_mem->B->d[j]);
      }
      erkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}